

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void __thiscall masc::polygon::c_ply::delete_vertex(c_ply *this,ply_vertex *v)

{
  pointer pppVar1;
  int iVar2;
  undefined4 extraout_var;
  ply_vertex *ppVar3;
  ply_vertex *this_00;
  undefined4 extraout_var_00;
  
  iVar2 = (*v->_vptr_ply_vertex[4])(v);
  this_00 = (ply_vertex *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*v->_vptr_ply_vertex[3])(v);
  ppVar3 = (ply_vertex *)CONCAT44(extraout_var_00,iVar2);
  ppVar3->pre = this_00;
  this_00->next = ppVar3;
  ply_vertex::computeExtraInfo(this_00);
  if (this->head == v) {
    this->head = ppVar3;
    this->tail = this_00;
  }
  (*v->_vptr_ply_vertex[1])(v);
  pppVar1 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar1) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar1;
  }
  return;
}

Assistant:

void c_ply::delete_vertex(ply_vertex * v)
{
    ply_vertex *pre=v->getPre();
    ply_vertex *next=v->getNext();

    pre->setNext(next);
    next->setPre(pre);
    pre->computeExtraInfo(); //recompute info

    if(head==v){
        head=next;
        tail=pre;
    }
    delete v;

    all.clear(); //not valid anymore
}